

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

bool __thiscall
bssl::anon_unknown_0::DecodeLowerHex
          (anon_unknown_0 *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,
          Span<const_char> in)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  
  pcVar5 = in.data_;
  if (((undefined1  [16])in & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,(ulong)pcVar5 >> 1);
    lVar4 = *(long *)this;
    bVar3 = true;
    if (*(long *)(this + 8) != lVar4) {
      pcVar6 = (char *)0x0;
      uVar7 = 0;
      do {
        if ((pcVar5 <= pcVar6) || (pcVar5 <= pcVar6 + 1)) {
          abort();
        }
        cVar1 = *(char *)((long)&(out->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_start + uVar7 * 2);
        cVar2 = *(char *)((long)&(out->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_start + uVar7 * 2 + 1);
        bVar9 = cVar1 - 0x30;
        if (9 < bVar9) {
          if (5 < (byte)(cVar1 + 0x9fU)) goto LAB_001e2c65;
          bVar9 = cVar1 + 0xa9;
        }
        bVar8 = cVar2 - 0x30;
        if (9 < bVar8) {
          if (5 < (byte)(cVar2 + 0x9fU)) goto LAB_001e2c65;
          bVar8 = cVar2 + 0xa9;
        }
        *(byte *)(lVar4 + uVar7) = bVar9 << 4 | bVar8;
        uVar7 = uVar7 + 1;
        lVar4 = *(long *)this;
        pcVar6 = pcVar6 + 2;
      } while (uVar7 < (ulong)(*(long *)(this + 8) - lVar4));
    }
  }
  else {
LAB_001e2c65:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool DecodeLowerHex(std::vector<uint8_t> *out,
                           bssl::Span<const char> in) {
  if (in.size() % 2 != 0) {
    return false;
  }
  out->resize(in.size() / 2);
  for (size_t i = 0; i < out->size(); i++) {
    char hi = in[2 * i], lo = in[2 * i + 1];
    uint8_t b = 0;
    if ('0' <= hi && hi <= '9') {
      b |= hi - '0';
    } else if ('a' <= hi && hi <= 'f') {
      b |= hi - 'a' + 10;
    } else {
      return false;
    }
    b <<= 4;
    if ('0' <= lo && lo <= '9') {
      b |= lo - '0';
    } else if ('a' <= lo && lo <= 'f') {
      b |= lo - 'a' + 10;
    } else {
      return false;
    }
    (*out)[i] = b;
  }
  return true;
}